

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scanner.cpp
# Opt level: O1

void __thiscall Refal2::CScanner::processingInitial(CScanner *this,char c)

{
  CDirectiveParser *pCVar1;
  int iVar2;
  TError error;
  undefined7 in_register_00000031;
  
  iVar2 = (int)CONCAT71(in_register_00000031,c);
  if (iVar2 < 0x20) {
    if (iVar2 == 0) {
      return;
    }
    if (iVar2 == 9) {
LAB_0013196e:
      iVar2 = this->position;
      pCVar1 = &(this->super_CParser).super_CDirectiveParser;
      (pCVar1->super_CRuleParser).super_CQualifierParser.token.line = this->line;
      (pCVar1->super_CRuleParser).super_CQualifierParser.token.position = iVar2;
      this->state = S_Blank;
      return;
    }
    if (iVar2 == 10) {
      iVar2 = this->position;
      pCVar1 = &(this->super_CParser).super_CDirectiveParser;
      (pCVar1->super_CRuleParser).super_CQualifierParser.token.line = this->line;
      (pCVar1->super_CRuleParser).super_CQualifierParser.token.position = iVar2;
      (this->super_CParser).super_CDirectiveParser.super_CRuleParser.super_CQualifierParser.token.
      type = TT_LineFeed;
      goto LAB_00131a88;
    }
    goto switchD_001318fd_caseD_2a;
  }
  switch(iVar2) {
  case 0x28:
    iVar2 = this->position;
    pCVar1 = &(this->super_CParser).super_CDirectiveParser;
    (pCVar1->super_CRuleParser).super_CQualifierParser.token.line = this->line;
    (pCVar1->super_CRuleParser).super_CQualifierParser.token.position = iVar2;
    (this->super_CParser).super_CDirectiveParser.super_CRuleParser.super_CQualifierParser.token.type
         = TT_LeftParen;
    break;
  case 0x29:
    iVar2 = this->position;
    pCVar1 = &(this->super_CParser).super_CDirectiveParser;
    (pCVar1->super_CRuleParser).super_CQualifierParser.token.line = this->line;
    (pCVar1->super_CRuleParser).super_CQualifierParser.token.position = iVar2;
    (this->super_CParser).super_CDirectiveParser.super_CRuleParser.super_CQualifierParser.token.type
         = TT_RightParen;
    break;
  case 0x2c:
    iVar2 = this->position;
    pCVar1 = &(this->super_CParser).super_CDirectiveParser;
    (pCVar1->super_CRuleParser).super_CQualifierParser.token.line = this->line;
    (pCVar1->super_CRuleParser).super_CQualifierParser.token.position = iVar2;
    (this->super_CParser).super_CDirectiveParser.super_CRuleParser.super_CQualifierParser.token.type
         = TT_Comma;
    break;
  case 0x2d:
    error = E_UnexpectedCharacter;
    goto LAB_001319c5;
  case 0x2e:
  case 0x3e:
    std::__cxx11::string::_M_replace_aux
              ((ulong)&(this->super_CParser).super_CDirectiveParser.super_CRuleParser.
                       super_CQualifierParser.token.word,0,
               (this->super_CParser).super_CDirectiveParser.super_CRuleParser.super_CQualifierParser
               .token.word._M_string_length,'\x01');
    iVar2 = this->position;
    pCVar1 = &(this->super_CParser).super_CDirectiveParser;
    (pCVar1->super_CRuleParser).super_CQualifierParser.token.line = this->line;
    (pCVar1->super_CRuleParser).super_CQualifierParser.token.position = iVar2;
    (this->super_CParser).super_CDirectiveParser.super_CRuleParser.super_CQualifierParser.token.type
         = TT_RightBracket;
    break;
  case 0x2f:
    iVar2 = this->position;
    pCVar1 = &(this->super_CParser).super_CDirectiveParser;
    (pCVar1->super_CRuleParser).super_CQualifierParser.token.line = this->line;
    (pCVar1->super_CRuleParser).super_CQualifierParser.token.position = iVar2;
    this->state = S_Symbol;
    return;
  case 0x3a:
    iVar2 = this->position;
    pCVar1 = &(this->super_CParser).super_CDirectiveParser;
    (pCVar1->super_CRuleParser).super_CQualifierParser.token.line = this->line;
    (pCVar1->super_CRuleParser).super_CQualifierParser.token.position = iVar2;
    this->state = S_BeginOfQualifier;
    return;
  case 0x3c:
    iVar2 = this->position;
    pCVar1 = &(this->super_CParser).super_CDirectiveParser;
    (pCVar1->super_CRuleParser).super_CQualifierParser.token.line = this->line;
    (pCVar1->super_CRuleParser).super_CQualifierParser.token.position = iVar2;
    (this->super_CParser).super_CDirectiveParser.super_CRuleParser.super_CQualifierParser.token.type
         = TT_LeftBracket;
    break;
  case 0x3d:
    iVar2 = this->position;
    pCVar1 = &(this->super_CParser).super_CDirectiveParser;
    (pCVar1->super_CRuleParser).super_CQualifierParser.token.line = this->line;
    (pCVar1->super_CRuleParser).super_CQualifierParser.token.position = iVar2;
    (this->super_CParser).super_CDirectiveParser.super_CRuleParser.super_CQualifierParser.token.type
         = TT_Equal;
    break;
  default:
    if (iVar2 == 0x20) goto LAB_0013196e;
  case 0x2a:
  case 0x2b:
  case 0x30:
  case 0x31:
  case 0x32:
  case 0x33:
  case 0x34:
  case 0x35:
  case 0x36:
  case 0x37:
  case 0x38:
  case 0x39:
  case 0x3b:
switchD_001318fd_caseD_2a:
    if ((((byte)(c - 0x30U) < 10) || (c == '_')) || ((byte)((c & 0xdfU) + 0xbf) < 0x1a)) {
      std::__cxx11::string::_M_replace_aux
                ((ulong)&(this->super_CParser).super_CDirectiveParser.super_CRuleParser.
                         super_CQualifierParser.token.word,0,
                 (this->super_CParser).super_CDirectiveParser.super_CRuleParser.
                 super_CQualifierParser.token.word._M_string_length,'\x01');
      iVar2 = this->position;
      pCVar1 = &(this->super_CParser).super_CDirectiveParser;
      (pCVar1->super_CRuleParser).super_CQualifierParser.token.line = this->line;
      (pCVar1->super_CRuleParser).super_CQualifierParser.token.position = iVar2;
      this->state = S_Word;
      return;
    }
    error = E_InvalidCharacter;
LAB_001319c5:
    CScanner::error(this,error,c);
    return;
  }
LAB_00131a88:
  CParser::AddToken(&this->super_CParser);
  return;
}

Assistant:

void CScanner::processingInitial( char c )
{
	switch( c ) {
		case Comma:
			addTokenWithCurrentLineAndPosition( TT_Comma );
			break;
		case Equal:
			addTokenWithCurrentLineAndPosition( TT_Equal );
			break;
		case LineFeed:
			addTokenWithCurrentLineAndPosition( TT_LineFeed );
			break;
		case LeftParen:
			addTokenWithCurrentLineAndPosition( TT_LeftParen );
			break;
		case RightParen:
			addTokenWithCurrentLineAndPosition( TT_RightParen );
			break;
		case LeftBracket:
			addTokenWithCurrentLineAndPosition( TT_LeftBracket );
			break;
		case Dot:
		case RightBracket:
			token.word = c;
			addTokenWithCurrentLineAndPosition( TT_RightBracket );
			break;
		case LimiterOfSymbol:
			setLineAndPositionOfToken();
			state = S_Symbol;
			break;
		case LimiterOfQualifier:
			setLineAndPositionOfToken();
			state = S_BeginOfQualifier;
			break;
		case UniversalSeparatorOfTokens:
			break;
		default:
			if( IsSpace( c ) ) {
				setLineAndPositionOfToken();
				state = S_Blank;
			} else if( c == Hyphen ) {
				error( E_UnexpectedCharacter, c );
			} else if( IsWordLetter( c ) ) {
				token.word = c;
				setLineAndPositionOfToken();
				state = S_Word;
			} else {
				error( E_InvalidCharacter, c );
			}
			break;
	}
}